

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O0

SimpleDictionaryEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::DictionaryPropertyDescriptor<int>_>
* __thiscall
Memory::
AllocateArray<Memory::Recycler,JsUtil::SimpleDictionaryEntry<Memory::WriteBarrierPtr<Js::PropertyRecord_const>,Js::DictionaryPropertyDescriptor<int>>,false>
          (Memory *this,Recycler *allocator,offset_in_Recycler_to_subr AllocFunc,size_t count)

{
  undefined1 auVar1 [16];
  size_t byteSize;
  SimpleDictionaryEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::DictionaryPropertyDescriptor<int>_>
  *local_68;
  size_t count_local;
  offset_in_Recycler_to_subr AllocFunc_local;
  Recycler *allocator_local;
  SimpleDictionaryEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::DictionaryPropertyDescriptor<int>_>
  *local_10;
  
  if (count == 0) {
    Recycler::ClearTrackAllocInfo((Recycler *)this,(TrackAllocData *)0x0);
    local_10 = (SimpleDictionaryEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::DictionaryPropertyDescriptor<int>_>
                *)0x8;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = count;
    byteSize = SUB168(auVar1 * ZEXT816(0x20),0);
    if (SUB168(auVar1 * ZEXT816(0x20),8) != 0) {
      byteSize = 0xffffffffffffffff;
    }
    local_10 = (SimpleDictionaryEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::DictionaryPropertyDescriptor<int>_>
                *)new__<Memory::Recycler>
                            (byteSize,(Recycler *)this,(offset_in_Recycler_to_subr)allocator);
    if (count != 0) {
      local_68 = local_10;
      do {
        JsUtil::
        SimpleDictionaryEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::DictionaryPropertyDescriptor<int>_>
        ::SimpleDictionaryEntry(local_68);
        local_68 = local_68 + 1;
      } while (local_68 != local_10 + count);
    }
  }
  return local_10;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}